

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebuilder.cpp
# Opt level: O3

Error __thiscall asmjit::CodeBuilder::embedConstPool(CodeBuilder *this,Label *label,ConstPool *pool)

{
  bool bVar1;
  Error EVar2;
  CBData *node;
  anon_union_24_2_ecfd7102_for_CBData_1 *dst;
  
  EVar2 = (this->super_CodeEmitter)._lastError;
  if (EVar2 == 0) {
    bVar1 = CodeEmitter::isLabelValid
                      (&this->super_CodeEmitter,
                       (label->super_Operand).super_Operand_.field_0._any.id);
    if (!bVar1) {
      EVar2 = 0xc;
LAB_001129c9:
      EVar2 = CodeEmitter::setLastError(&this->super_CodeEmitter,EVar2,(char *)0x0);
      return EVar2;
    }
    EVar2 = (*(this->super_CodeEmitter)._vptr_CodeEmitter[10])(this,1,(ulong)(uint)pool->_alignment)
    ;
    if (EVar2 == 0) {
      EVar2 = (*(this->super_CodeEmitter)._vptr_CodeEmitter[9])(this);
      if (EVar2 == 0) {
        node = newDataNode(this,(void *)0x0,(uint32_t)pool->_size);
        if (node == (CBData *)0x0) {
          EVar2 = 1;
          goto LAB_001129c9;
        }
        if ((node->field_0).field_0._size < 0x15) {
          dst = &node->field_0;
        }
        else {
          dst = (anon_union_24_2_ecfd7102_for_CBData_1 *)(node->field_0).field_1._externalPtr;
        }
        ConstPool::fill(pool,dst);
        addNode(this,&node->super_CBNode);
        EVar2 = 0;
      }
    }
  }
  return EVar2;
}

Assistant:

Error CodeBuilder::embedConstPool(const Label& label, const ConstPool& pool) {
  if (_lastError) return _lastError;

  if (!isLabelValid(label))
    return setLastError(DebugUtils::errored(kErrorInvalidLabel));

  ASMJIT_PROPAGATE(align(kAlignData, static_cast<uint32_t>(pool.getAlignment())));
  ASMJIT_PROPAGATE(bind(label));

  CBData* node = newDataNode(nullptr, static_cast<uint32_t>(pool.getSize()));
  if (ASMJIT_UNLIKELY(!node))
    return setLastError(DebugUtils::errored(kErrorNoHeapMemory));

  pool.fill(node->getData());
  addNode(node);
  return kErrorOk;
}